

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool anon_unknown.dwarf_d1289::hufUncompress
               (char *compressed,int nCompressed,unsigned_short *raw,int nRaw)

{
  bool bVar1;
  uint iM_00;
  uint im_00;
  uint uVar2;
  int iVar3;
  reference hdecod;
  reference hcode;
  int in_ECX;
  size_type in_RDX;
  int in_ESI;
  char *in_RDI;
  vector<(anonymous_namespace)::HufDec,_std::allocator<(anonymous_namespace)::HufDec>_> hdec;
  vector<long_long,_std::allocator<long_long>_> freq;
  char *ptr;
  int nBits;
  int iM;
  int im;
  size_type in_stack_ffffffffffffff08;
  vector<(anonymous_namespace)::HufDec,_std::allocator<(anonymous_namespace)::HufDec>_>
  *in_stack_ffffffffffffff10;
  allocator_type *in_stack_ffffffffffffff20;
  size_type in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined8 in_stack_ffffffffffffff38;
  int iM_01;
  undefined8 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  HufDec *in_stack_ffffffffffffffa0;
  longlong *in_stack_ffffffffffffffa8;
  unsigned_short *in_stack_ffffffffffffffc0;
  int local_38;
  int local_10;
  byte local_1;
  
  iM_01 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  if (in_ESI == 0) {
    if (in_ECX == 0) {
      local_1 = 0;
    }
    else {
      local_1 = 0;
    }
  }
  else {
    iM_00 = readUInt(in_RDI);
    im_00 = readUInt(in_RDI + 4);
    uVar2 = readUInt(in_RDI + 0xc);
    if (((((int)iM_00 < 0) || (0x10000 < (int)iM_00)) || ((int)im_00 < 0)) || (0x10000 < (int)im_00)
       ) {
      local_1 = 0;
    }
    else {
      std::allocator<long_long>::allocator((allocator<long_long> *)0x1a08a8);
      std::vector<long_long,_std::allocator<long_long>_>::vector
                ((vector<long_long,_std::allocator<long_long>_> *)
                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff28,(allocator_type *)in_stack_ffffffffffffff20);
      std::allocator<long_long>::~allocator((allocator<long_long> *)0x1a08ce);
      std::allocator<(anonymous_namespace)::HufDec>::allocator
                ((allocator<(anonymous_namespace)::HufDec> *)0x1a08dd);
      std::vector<(anonymous_namespace)::HufDec,_std::allocator<(anonymous_namespace)::HufDec>_>::
      vector((vector<(anonymous_namespace)::HufDec,_std::allocator<(anonymous_namespace)::HufDec>_>
              *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      std::allocator<(anonymous_namespace)::HufDec>::~allocator
                ((allocator<(anonymous_namespace)::HufDec> *)0x1a08fd);
      hdecod = std::
               vector<(anonymous_namespace)::HufDec,_std::allocator<(anonymous_namespace)::HufDec>_>
               ::at(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      hufClearDecTable(hdecod);
      local_38 = (int)(in_RDI + 0x14);
      local_10 = (int)in_RDI;
      iVar3 = in_ESI + (local_10 - local_38);
      hcode = std::vector<long_long,_std::allocator<long_long>_>::at
                        ((vector<long_long,_std::allocator<long_long>_> *)in_stack_ffffffffffffff10,
                         in_stack_ffffffffffffff08);
      hufUnpackEncTable((char **)CONCAT44(iVar3,in_stack_ffffffffffffff48),
                        (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                        (int)in_stack_ffffffffffffff40,iM_01,
                        (longlong *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      bVar1 = (long)(int)uVar2 <= ((long)in_ESI - ((long)(in_RDI + 0x14) - (long)in_RDI)) * 8;
      if (bVar1) {
        std::vector<long_long,_std::allocator<long_long>_>::at
                  ((vector<long_long,_std::allocator<long_long>_> *)in_stack_ffffffffffffff10,
                   in_stack_ffffffffffffff08);
        std::vector<(anonymous_namespace)::HufDec,_std::allocator<(anonymous_namespace)::HufDec>_>::
        at(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        hufBuildDecTable(hcode,im_00,iM_00,(HufDec *)CONCAT44(iVar3,in_stack_ffffffffffffff48));
        std::vector<long_long,_std::allocator<long_long>_>::at
                  ((vector<long_long,_std::allocator<long_long>_> *)in_stack_ffffffffffffff10,
                   in_stack_ffffffffffffff08);
        in_stack_ffffffffffffff20 =
             (allocator_type *)
             std::
             vector<(anonymous_namespace)::HufDec,_std::allocator<(anonymous_namespace)::HufDec>_>::
             at(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        hufDecode(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                  in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                  in_stack_ffffffffffffffc0);
        std::vector<(anonymous_namespace)::HufDec,_std::allocator<(anonymous_namespace)::HufDec>_>::
        at(in_stack_ffffffffffffff10,in_RDX);
        hufFreeDecTable((HufDec *)in_stack_ffffffffffffff10);
      }
      else {
        local_1 = 0;
      }
      std::vector<(anonymous_namespace)::HufDec,_std::allocator<(anonymous_namespace)::HufDec>_>::
      ~vector((vector<(anonymous_namespace)::HufDec,_std::allocator<(anonymous_namespace)::HufDec>_>
               *)in_stack_ffffffffffffff20);
      std::vector<long_long,_std::allocator<long_long>_>::~vector
                ((vector<long_long,_std::allocator<long_long>_> *)in_stack_ffffffffffffff20);
      if (bVar1) {
        local_1 = 1;
      }
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool hufUncompress(const char compressed[], int nCompressed,
                   unsigned short raw[], int nRaw) {
  if (nCompressed == 0) {
    if (nRaw != 0)
      return false;

    return false;
  }

  int im = readUInt(compressed);
  int iM = readUInt(compressed + 4);
  // int tableLength = readUInt (compressed + 8);
  int nBits = readUInt(compressed + 12);

  if (im < 0 || im >= HUF_ENCSIZE || iM < 0 || iM >= HUF_ENCSIZE)
    return false;

  const char *ptr = compressed + 20;

  //
  // Fast decoder needs at least 2x64-bits of compressed data, and
  // needs to be run-able on this platform. Otherwise, fall back
  // to the original decoder
  //

  // if (FastHufDecoder::enabled() && nBits > 128)
  //{
  //    FastHufDecoder fhd (ptr, nCompressed - (ptr - compressed), im, iM, iM);
  //    fhd.decode ((unsigned char*)ptr, nBits, raw, nRaw);
  //}
  // else
  {
    std::vector<long long> freq(HUF_ENCSIZE);
    std::vector<HufDec> hdec(HUF_DECSIZE);

    hufClearDecTable(&hdec.at(0));

    hufUnpackEncTable(&ptr, nCompressed - (ptr - compressed), im, iM, &freq.at(0));

    {
      if (nBits > 8 * (nCompressed - (ptr - compressed))) {
        return false;
      }

      hufBuildDecTable(&freq.at(0), im, iM, &hdec.at(0));
      hufDecode(&freq.at(0), &hdec.at(0), ptr, nBits, iM, nRaw, raw);
    }
    // catch (...)
    //{
    //    hufFreeDecTable (hdec);
    //    throw;
    //}

    hufFreeDecTable(&hdec.at(0));
  }

  return true;
}